

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O3

int __thiscall
chaiscript::detail::Any::
Data_Impl<std::reference_wrapper<const_chaiscript::dispatch::Proxy_Function_Base>_>::clone
          (Data_Impl<std::reference_wrapper<const_chaiscript::dispatch::Proxy_Function_Base>_> *this
          ,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  
  pp_Var2 = (_func_int **)operator_new(0x18);
  p_Var1 = *(_func_int **)(__fn + 0x10);
  pp_Var2[1] = (_func_int *)
               &std::reference_wrapper<chaiscript::dispatch::Proxy_Function_Base_const>::typeinfo;
  *pp_Var2 = (_func_int *)&PTR__Data_00401e50;
  pp_Var2[2] = p_Var1;
  (this->super_Data)._vptr_Data = pp_Var2;
  return (int)this;
}

Assistant:

std::unique_ptr<Data> clone() const override { return std::make_unique<Data_Impl<T>>(m_data); }